

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O2

void duckdb::PositionListCursor
               (SelectionVector *cursor,UnifiedVectorFormat *vdata,idx_t pos,
               SelectionVector *slice_sel,idx_t count)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  idx_t i;
  idx_t iVar6;
  idx_t iVar7;
  
  pSVar1 = vdata->sel;
  pdVar2 = vdata->data;
  psVar3 = slice_sel->sel_vector;
  psVar4 = cursor->sel_vector;
  for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
    iVar7 = iVar6;
    if (psVar3 != (sel_t *)0x0) {
      iVar7 = (idx_t)psVar3[iVar6];
    }
    psVar5 = pSVar1->sel_vector;
    if (psVar5 != (sel_t *)0x0) {
      iVar7 = (idx_t)psVar5[iVar7];
    }
    psVar4[iVar6] = *(int *)(pdVar2 + iVar7 * 0x10) + (int)pos;
  }
  return;
}

Assistant:

static void PositionListCursor(SelectionVector &cursor, UnifiedVectorFormat &vdata, const idx_t pos,
                               const SelectionVector &slice_sel, const idx_t count) {
	const auto data = UnifiedVectorFormat::GetData<list_entry_t>(vdata);
	for (idx_t i = 0; i < count; ++i) {
		const auto slice_idx = slice_sel.get_index(i);

		const auto lidx = vdata.sel->get_index(slice_idx);
		const auto &entry = data[lidx];
		cursor.set_index(i, entry.offset + pos);
	}
}